

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_model_component.cpp
# Opt level: O1

bool __thiscall
ON_BinaryArchive::Write3dmReferencedComponentIndex
          (ON_BinaryArchive *this,Type component_type,ON_UUID model_id)

{
  bool bVar1;
  Type TVar2;
  int iVar3;
  ON_ManifestMapItem *this_00;
  char *sFormat;
  ON_UUID_struct local_28;
  
  local_28.Data4 = model_id.Data4;
  local_28._0_8_ = model_id._0_8_;
  bVar1 = ::operator==(&ON_nil_uuid,&local_28);
  if (bVar1) {
    sFormat = "model_id is nil.";
    iVar3 = 0xc79;
  }
  else {
    this_00 = ON_ManifestMap::MapItemFromSourceId(&this->m_manifest_map,&local_28);
    TVar2 = ON_ManifestMapItem::ComponentType(this_00);
    if ((TVar2 == component_type) && (bVar1 = ON_ManifestMapItem::SourceIsSet(this_00), bVar1)) {
      if (this->m_bReferencedComponentIndexMapping == false) {
        iVar3 = ON_ManifestMapItem::SourceIndex(this_00);
        goto LAB_0053ccda;
      }
      iVar3 = ON_ManifestMapItem::DestinationIndex(this_00);
      if (iVar3 != -0x7fffffff) {
        iVar3 = ON_ManifestMapItem::DestinationIndex(this_00);
        goto LAB_0053ccda;
      }
      sFormat = "Unable to get archive component reference index.";
      iVar3 = 0xc92;
    }
    else {
      sFormat = "model_id not in archive manifest map.";
      iVar3 = 0xc82;
    }
  }
  ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_model_component.cpp"
             ,iVar3,"",sFormat);
  iVar3 = -0x7fffffff;
LAB_0053ccda:
  bVar1 = WriteInt(this,iVar3);
  return bVar1;
}

Assistant:

bool ON_BinaryArchive::Write3dmReferencedComponentIndex(
  ON_ModelComponent::Type component_type,
  ON_UUID model_id
  )
{
  // When writing 3dm archives, the model index needs to be converted
  // to an archive index.  This function is used when the model component
  // id is known.
  int archive_index = ON_UNSET_INT_INDEX;
  if (ON_nil_uuid == model_id)
  {
    ON_ERROR("model_id is nil.");
  }
  else
  {
    const ON_ManifestMapItem& map_item = ManifestMap().MapItemFromSourceId(model_id);
    if (component_type != map_item.ComponentType() 
      || false == map_item.SourceIsSet()
      )
    {
      ON_ERROR("model_id not in archive manifest map.");
    }
    else if (false == ReferencedComponentIndexMapping())
    {
      // component reference mapping is disabled (rare)
      archive_index = map_item.SourceIndex();
    }
    else
    {
      // adjust component reference to use the index in the archive (common)
      if (ON_UNSET_INT_INDEX != map_item.DestinationIndex())
      {
        archive_index = map_item.DestinationIndex();
      }
      else
      {
        ON_ERROR("Unable to get archive component reference index.");
      }
    }
  }
  return WriteInt(archive_index);
}